

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_reserve_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  undefined8 uVar9;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  size_t local_30;
  size_t local_28;
  undefined8 *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 8;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = (undefined8 *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  *local_20 = 0x3035353535353535;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_48,0x20,false,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf3);
    if (local_30 != 8) {
      pcVar7 = "private_ACUtilsTest_ADynArray_capacityMin";
      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar5 = "array.size";
      iVar3 = 0xf4;
      uVar9 = 8;
      sVar6 = local_30;
      goto LAB_0010b484;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf4);
    if (local_28 != 0x20) {
      pcVar7 = "private_ACUtilsTest_ADynArray_capacityMax";
      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMax";
      pcVar5 = "array.capacity";
      iVar3 = 0xf5;
      uVar9 = 0x20;
      sVar6 = local_28;
      goto LAB_0010b484;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf5);
    if (local_20 == (undefined8 *)0x0) {
      pcVar4 = "(void*) array.buffer != NULL";
      pcVar5 = "(void*) array.buffer";
      iVar3 = 0xf6;
LAB_0010b5d7:
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,iVar3,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x",pcVar4,pcVar5,0,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf6);
    lVar8 = 0;
    do {
      if ((long)*(char *)((long)local_20 + lVar8) != 0x35) {
        pcVar7 = "\'5\'";
        pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar4 = "array.buffer[i] == \'5\'";
        pcVar5 = "array.buffer[i]";
        iVar3 = 0xf8;
        uVar9 = 0x35;
        sVar6 = (long)*(char *)((long)local_20 + lVar8);
        goto LAB_0010b484;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xf8);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 7);
    if ((long)*(char *)((long)local_20 + 7) != 0x30) {
      pcVar7 = "\'0\'";
      pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
      pcVar4 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
      pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
      iVar3 = 0xf9;
      uVar9 = 0x30;
      sVar6 = (long)*(char *)((long)local_20 + 7);
      goto LAB_0010b484;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf9);
    if (local_38 == (code *)0x0) {
      pcVar4 = "(void*) array.growStrategy != NULL";
      pcVar5 = "(void*) array.growStrategy";
      iVar3 = 0xfa;
      goto LAB_0010b5d7;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xfa);
    if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xfb);
      (*pcStack_40)(local_20);
      return;
    }
    pcVar7 = "1";
    pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
    pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount";
    iVar3 = 0xfb;
    sVar6 = private_ACUtilsTest_ADynArray_reallocCount;
  }
  else {
    sVar6 = (size_t)bVar1;
    pcVar7 = "true";
    pcVar4 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer))"
    ;
    iVar3 = 0xf3;
  }
  pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  uVar9 = 1;
LAB_0010b484:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar3,"Assertion \'_ck_x == _ck_y\' failed",pcVar2,pcVar4,pcVar5,sVar6,pcVar7,
                    uVar9,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_success_notEnoughCapacity)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMax);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}